

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O2

char * matchName(char **data,char terminus)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  
  pcVar4 = *data;
  iVar6 = 0;
  pcVar2 = pcVar4;
  do {
    pcVar5 = pcVar2 + 1;
    cVar1 = *pcVar2;
    if (cVar1 == '\0') {
      if (terminus != '\0') {
        pcVar4 = (char *)0x0;
      }
      return pcVar4;
    }
    iVar3 = isalnum((int)cVar1);
    if (((iVar3 == 0) && (cVar1 != ':')) && (cVar1 != '_')) {
      if (cVar1 == '<') {
        iVar6 = iVar6 + 1;
      }
      else if (iVar6 < 1 || cVar1 != '>') {
        if (iVar6 == 0) {
          if (cVar1 == terminus) {
            *data = pcVar5;
            *pcVar2 = '\0';
            return pcVar4;
          }
          return (char *)0x0;
        }
      }
      else {
        iVar6 = iVar6 + -1;
      }
    }
    *data = pcVar5;
    pcVar2 = pcVar5;
  } while( true );
}

Assistant:

inline char *matchName(char *&data, char terminus)
{
    char *start = data;

    for (int nrAngles = 0; *data; ++data) {
        if (isalnum(*data) || (*data == ':') || (*data == '_')) {
            continue;
        }
        if (*data == '<') {
            ++nrAngles;
            continue;
        }
        if ((*data == '>') && (nrAngles > 0)) {
            --nrAngles;
            continue;
        }
        if (nrAngles == 0) {
            break;
        }
    }

    if (*data != terminus) {
        return nullptr;
    }
    if (*data == '\0') {
        return start;
    }
    *(data++) = '\0';
    return start;
}